

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  _func_int **pp_Var1;
  
  *(undefined8 *)&this[-1].field_0x60 = 0x9198f0;
  *(undefined8 *)&this->field_0x48 = 0x919968;
  *(undefined8 *)this = 0x919918;
  *(undefined8 *)&this->field_0x10 = 0x919940;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x919a80;
  *(undefined8 *)&this->field_0x48 = 0x919aa8;
  if (*(undefined1 **)&this[-1].field_0xc0 != &this[-1].field_0xd0) {
    operator_delete(*(undefined1 **)&this[-1].field_0xc0);
  }
  pp_Var1 = this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper;
  if (pp_Var1 !=
      (_func_int **)&this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10
     ) {
    operator_delete(pp_Var1);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70);
    return;
  }
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}